

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O2

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  char cVar1;
  byte bVar2;
  size_type sVar3;
  undefined8 *puVar4;
  long lVar5;
  LogMessage *pLVar6;
  int iVar7;
  pointer pcVar8;
  int iVar9;
  long lVar10;
  uint value;
  char *__dest;
  long alStack_208 [31];
  undefined8 uStack_110;
  LogFinisher local_102;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  LogMessage local_c0;
  SubstituteArg *args_array [11];
  
  args_array[0] = arg0;
  args_array[1] = arg1;
  args_array[2] = arg2;
  args_array[3] = arg3;
  args_array[4] = arg4;
  args_array[5] = arg5;
  args_array[6] = arg6;
  args_array[7] = arg7;
  args_array[8] = arg8;
  args_array[9] = arg9;
  args_array[10] = (SubstituteArg *)0x0;
  iVar7 = 0;
  iVar9 = 0;
  do {
    cVar1 = format[iVar7];
    if (cVar1 == '\0') goto LAB_0021e02e;
    if (cVar1 == '$') {
      bVar2 = format[(long)iVar7 + 1];
      iVar7 = iVar7 + 1;
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 == 0x24) goto LAB_0021deba;
        uStack_110 = 0x21deda;
        protobuf::internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                   ,0x61);
        uStack_110 = 0x21dee9;
        pLVar6 = protobuf::internal::LogMessage::operator<<
                           (&local_c0,"Invalid strings::Substitute() format string: \"");
        uStack_110 = 0x21defe;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,format,&local_101);
        uStack_110 = 0x21df0d;
        CEscape(&local_100,&local_e0);
        uStack_110 = 0x21df1a;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,&local_100);
        uStack_110 = 0x21df29;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"\".");
        uStack_110 = 0x21df36;
        protobuf::internal::LogFinisher::operator=(&local_102,pLVar6);
        uStack_110 = 0x21df40;
        std::__cxx11::string::~string((string *)&local_100);
        uStack_110 = 0x21df4a;
        std::__cxx11::string::~string((string *)&local_e0);
        goto LAB_0021e10a;
      }
      value = bVar2 - 0x30;
      if (args_array[value]->size_ == -1) {
        uStack_110 = 0x21df66;
        protobuf::internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                   ,0x54);
        uStack_110 = 0x21df77;
        pLVar6 = protobuf::internal::LogMessage::operator<<
                           (&local_c0,"strings::Substitute format string invalid: asked for \"$");
        uStack_110 = 0x21df82;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,value);
        uStack_110 = 0x21df91;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"\", but only ");
        lVar10 = 0;
        while ((arg0 != (SubstituteArg *)0x0 && (arg0->size_ != -1))) {
          lVar5 = lVar10 + 1;
          lVar10 = lVar10 + 1;
          arg0 = args_array[lVar5];
        }
        uStack_110 = 0x21dfb4;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,(int)lVar10);
        uStack_110 = 0x21dfc3;
        pLVar6 = protobuf::internal::LogMessage::operator<<
                           (pLVar6," args were given.  Full format string was: \"");
        uStack_110 = 0x21dfd8;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,format,&local_101);
        uStack_110 = 0x21dfe7;
        CEscape(&local_100,&local_e0);
        uStack_110 = 0x21dff4;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,&local_100);
        uStack_110 = 0x21e003;
        pLVar6 = protobuf::internal::LogMessage::operator<<(pLVar6,"\".");
        uStack_110 = 0x21e010;
        protobuf::internal::LogFinisher::operator=(&local_102,pLVar6);
        uStack_110 = 0x21e01a;
        std::__cxx11::string::~string((string *)&local_100);
        uStack_110 = 0x21e024;
        std::__cxx11::string::~string((string *)&local_e0);
        uStack_110 = 0x21e02e;
        protobuf::internal::LogMessage::~LogMessage(&local_c0);
LAB_0021e02e:
        if (cVar1 != '\0') {
          return;
        }
        if (iVar9 == 0) {
          return;
        }
        sVar3 = output->_M_string_length;
        uStack_110 = 0x21e051;
        std::__cxx11::string::resize((ulong)output);
        iVar7 = 0;
        if (output->_M_string_length == 0) {
          pcVar8 = (pointer)0x0;
        }
        else {
          pcVar8 = (output->_M_dataplus)._M_p;
        }
        __dest = pcVar8 + (int)sVar3;
        do {
          cVar1 = format[iVar7];
          if (cVar1 == '$') {
            bVar2 = format[(long)iVar7 + 1];
            if ((byte)(bVar2 - 0x30) < 10) {
              puVar4 = (undefined8 *)alStack_208[bVar2];
              uStack_110 = 0x21e0ac;
              memcpy(__dest,(void *)*puVar4,(long)*(int *)(puVar4 + 1));
              __dest = __dest + *(int *)(puVar4 + 1);
              iVar7 = iVar7 + 1;
            }
            else if (bVar2 == 0x24) {
              *__dest = '$';
              __dest = __dest + 1;
              iVar7 = iVar7 + 1;
            }
          }
          else {
            if (cVar1 == '\0') {
              if ((long)__dest - (long)(output->_M_dataplus)._M_p == output->_M_string_length) {
                return;
              }
              uStack_110 = 0x21e0ee;
              protobuf::internal::LogMessage::LogMessage
                        (&local_c0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/substitute.cc"
                         ,0x81);
              uStack_110 = 0x21e0fd;
              pLVar6 = protobuf::internal::LogMessage::operator<<
                                 (&local_c0,
                                  "CHECK failed: (target - output->data()) == (output->size()): ");
              uStack_110 = 0x21e10a;
              protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar6);
LAB_0021e10a:
              uStack_110 = 0x21e114;
              protobuf::internal::LogMessage::~LogMessage(&local_c0);
              return;
            }
            *__dest = cVar1;
            __dest = __dest + 1;
          }
          iVar7 = iVar7 + 1;
        } while( true );
      }
      iVar9 = iVar9 + args_array[value]->size_;
    }
    else {
LAB_0021deba:
      iVar9 = iVar9 + 1;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, NULL
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        const SubstituteArg* src = args_array[format[i+1] - '0'];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}